

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

bool duckdb::CanScaleDownDecimal<short>(short input,DecimalScaleInput<short,_short> *data)

{
  short sVar1;
  long lVar2;
  int iVar3;
  short sVar4;
  int iVar5;
  long lVar6;
  undefined6 in_register_0000003a;
  long lVar7;
  short sVar8;
  
  lVar2 = *(long *)(NumericHelper::POWERS_OF_TEN + (ulong)data->source_scale * 8);
  lVar6 = (long)(int)CONCAT62(in_register_0000003a,input) % lVar2;
  lVar7 = -lVar6;
  if (-1 < input) {
    lVar7 = lVar6;
  }
  sVar8 = -input;
  if (0 < input) {
    sVar8 = input;
  }
  sVar4 = (short)lVar2;
  if (lVar7 < lVar2 / 2) {
    sVar4 = 0;
  }
  sVar1 = data->limit;
  iVar5 = (int)(short)(sVar4 + sVar8);
  iVar3 = -(int)sVar1;
  return (iVar5 != iVar3 && SBORROW4(iVar5,iVar3) == iVar5 + sVar1 < 0) &&
         (short)(sVar4 + sVar8) < sVar1;
}

Assistant:

bool CanScaleDownDecimal(INPUT_TYPE input, DecimalScaleInput<INPUT_TYPE> &data) {
	int64_t divisor = UnsafeNumericCast<int64_t>(NumericHelper::POWERS_OF_TEN[data.source_scale]);
	auto value = input % divisor;
	auto rounded_input = input;
	if (rounded_input < 0) {
		rounded_input *= -1;
		value *= -1;
	}
	if (value >= divisor / 2) {
		rounded_input += divisor;
	}
	return rounded_input < data.limit && rounded_input > -data.limit;
}